

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
chaiscript::dispatch::detail::
call_func<std::__cxx11::string(*)(chaiscript::Boxed_Value_const&),std::__cxx11::string,chaiscript::Boxed_Value_const&,0ul>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,undefined8 param_2,undefined8 *param_1,undefined8 *param_4,
          Type_Conversions_State *param_5)

{
  code *pcVar1;
  Boxed_Value BVar2;
  chaiscript acStack_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  pcVar1 = (code *)*param_1;
  BVar2 = boxed_cast<chaiscript::Boxed_Value_const&>(acStack_28,(Boxed_Value *)*param_4,param_5);
  (*pcVar1)(__return_storage_ptr__,acStack_28,
            BVar2.m_data.
            super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return __return_storage_ptr__;
}

Assistant:

Ret call_func(Ret (*)(Params...),
                    std::index_sequence<I...>,
                    const Callable &f,
                    [[maybe_unused]] const chaiscript::Function_Params &params,
                    [[maybe_unused]] const Type_Conversions_State &t_conversions) {
        return f(boxed_cast<Params>(params[I], &t_conversions)...);
      }